

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pointer __thiscall
pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
make_terminal_matcher<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>,std::__cxx11::string*,bool_const&>
          (parser<callbacks_proxy<mock_json_callbacks>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args,bool *args_1)

{
  pointer psVar1;
  byte *in_RCX;
  _Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  extraout_RDX;
  pointer pVar2;
  deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_> local_31;
  not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_30;
  byte *local_28;
  bool *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args_local;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_local;
  
  local_28 = in_RCX;
  args_local_1 = args_1;
  args_local = args;
  this_local = (parser<callbacks_proxy<mock_json_callbacks>_> *)this;
  psVar1 = std::
           unique_ptr<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           ::operator->((unique_ptr<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
                         *)args);
  gsl::not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
  not_null(&local_30,
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)args_local_1);
  details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::string_matcher
            ((string_matcher<callbacks_proxy<mock_json_callbacks>_> *)&(psVar1->terminal).__align,
             local_30,(bool)(*local_28 & 1));
  details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>::deleter
            (&local_31,false);
  std::
  unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>,pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>>
  ::
  unique_ptr<pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>,void>
            ((unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>,pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>>
              *)this,(pointer)&(psVar1->terminal).__align,&local_31);
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl = extraout_RDX._M_head_impl;
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._0_8_ = this;
  return (pointer)pVar2._M_t.
                  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ;
}

Assistant:

auto parser<Callbacks>::make_terminal_matcher (Args &&... args) -> pointer {
            static_assert (sizeof (Matcher) <= sizeof (decltype (singletons_->terminal)),
                           "terminal storage is not large enough for Matcher type");
            static_assert (alignof (Matcher) <= alignof (decltype (singletons_->terminal)),
                           "terminal storage is not sufficiently aligned for Matcher type");

            return pointer (new (&singletons_->terminal) Matcher (std::forward<Args> (args)...),
                            typename pointer::deleter_type{false});
        }